

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O2

void __thiscall CMenus::CMenus(CMenus *this)

{
  char *pcVar1;
  int64 iVar2;
  array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_> *this_00;
  EVP_PKEY_CTX *in_RSI;
  long lVar3;
  
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CMenus_00207420;
  array<CMenus::CMenuImage,_allocator_default<CMenus::CMenuImage>_>::init
            (&this->m_lMenuImages,in_RSI);
  array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>::init
            (&(this->m_lThemes).super_array<CMenus::CTheme,_allocator_default<CMenus::CTheme>_>,
             in_RSI);
  array<CMenus::CGameIcon,_allocator_default<CMenus::CGameIcon>_>::init(&this->m_lGameIcons,in_RSI);
  (this->m_GameIconDefault).m_Id = -1;
  array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_>::init
            (&(this->m_lDemos).super_array<CMenus::CDemoItem,_allocator_default<CMenus::CDemoItem>_>
             ,in_RSI);
  this_00 = &this->m_lFriendList[0].
             super_array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_>;
  lVar3 = 0;
  do {
    array<CMenus::CFriendItem,_allocator_default<CMenus::CFriendItem>_>::init(this_00,in_RSI);
    lVar3 = lVar3 + -0x10;
    this_00 = this_00 + 1;
  } while (lVar3 != -0x30);
  array<CMenus::CBrowserFilter,_allocator_default<CMenus::CBrowserFilter>_>::init
            (&this->m_lFilters,in_RSI);
  array<CVideoMode,_allocator_default<CVideoMode>_>::init
            (&(this->m_lRecommendedVideoModes).
              super_array<CVideoMode,_allocator_default<CVideoMode>_>,in_RSI);
  array<CVideoMode,_allocator_default<CVideoMode>_>::init
            (&(this->m_lOtherVideoModes).super_array<CVideoMode,_allocator_default<CVideoMode>_>,
             in_RSI);
  CMenusKeyBinder::CMenusKeyBinder(&this->m_Binder);
  this->m_ActivePage = 5;
  this->m_GamePage = 1;
  this->m_Popup = 0;
  this->m_SidebarTab = 0;
  this->m_SidebarActive = true;
  this->m_ShowServerDetails = true;
  this->m_LastBrowserType = -1;
  this->m_AddressSelection = 0;
  for (lVar3 = 0x2c0; lVar3 != 0x2c2; lVar3 = lVar3 + 1) {
    pcVar1 = this->m_aPopupTitle + lVar3 * 4 + -0x4b;
    pcVar1[0] = -2;
    pcVar1[1] = -1;
    pcVar1[2] = -1;
    pcVar1[3] = -1;
    pcVar1 = this->m_aPopupTitle + lVar3 * 4 + -0x43;
    pcVar1[0] = -1;
    pcVar1[1] = -1;
    pcVar1[2] = -1;
    pcVar1[3] = -1;
  }
  this->m_NeedRestartSound = false;
  this->m_NeedRestartPlayer = false;
  this->m_NeedRestartGraphics = false;
  this->m_TeePartSelected = 0;
  this->m_aSaveSkinName[0] = '\0';
  this->m_RefreshSkinSelector = true;
  this->m_pSelectedSkin = (CSkin *)0x0;
  this->m_MenuActive = true;
  this->m_SeekBarActivatedTime = 0;
  this->m_SeekBarActive = true;
  this->m_SkinModified = false;
  this->m_KeyReaderWasActive = false;
  this->m_KeyReaderIsActive = false;
  SetMenuPage(this,10);
  this->m_MenuPageOld = 10;
  this->m_aDemoLoadingFile[0] = '\0';
  this->m_DemoLoadingPopupRendered = false;
  iVar2 = time_get();
  this->m_LastInput = iVar2;
  str_copy(this->m_aCurrentDemoFolder,"demos",0x200);
  this->m_aCallvoteReason[0] = '\0';
  this->m_aFilterString[0] = '\0';
  this->m_ActiveListBox = 0;
  this->m_PopupCountrySelection = -2;
  return;
}

Assistant:

CMenus::CMenus()
{
	m_Popup = POPUP_NONE;
	m_ActivePage = PAGE_INTERNET;
	m_GamePage = PAGE_GAME;

	m_SidebarTab = 0;
	m_SidebarActive = true;
	m_ShowServerDetails = true;
	m_LastBrowserType = -1;
	m_AddressSelection = 0;
	for(int Type = 0; Type < IServerBrowser::NUM_TYPES; Type++)
	{
		m_aSelectedFilters[Type] = -2;
		m_aSelectedServers[Type] = -1;
	}

	m_NeedRestartGraphics = false;
	m_NeedRestartSound = false;
	m_NeedRestartPlayer = false;
	m_TeePartSelected = SKINPART_BODY;
	m_aSaveSkinName[0] = 0;
	m_RefreshSkinSelector = true;
	m_pSelectedSkin = 0;
	m_MenuActive = true;
	m_SeekBarActivatedTime = 0;
	m_SeekBarActive = true;
	m_SkinModified = false;
	m_KeyReaderWasActive = false;
	m_KeyReaderIsActive = false;

	SetMenuPage(PAGE_START);
	m_MenuPageOld = PAGE_START;

	m_aDemoLoadingFile[0] = 0;
	m_DemoLoadingPopupRendered = false;

	m_LastInput = time_get();

	str_copy(m_aCurrentDemoFolder, "demos", sizeof(m_aCurrentDemoFolder));
	m_aCallvoteReason[0] = 0;
	m_aFilterString[0] = 0;

	m_ActiveListBox = ACTLB_NONE;

	m_PopupCountrySelection = -2;
}